

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O2

TermList ApplicativeHelper::getHead(Term *t)

{
  bool bVar1;
  
  while( true ) {
    bVar1 = Kernel::Term::isApplication(t);
    if (!bVar1) {
      return (TermList)(uint64_t)t;
    }
    t = (Term *)t->_args[(ulong)(*(uint *)&t->field_0xc & 0xfffffff) - 2]._content;
    if (((ulong)t & 3) != 0) break;
    if (0xfffffff8 < t->_functor) {
      return (TermList)(uint64_t)t;
    }
  }
  return (TermList)(uint64_t)t;
}

Assistant:

TermList ApplicativeHelper::getHead(Term* t)
{
  TermList trm = TermList(t);
  while(t->isApplication()){
    trm = *t->nthArgument(2);
    if(!trm.isTerm() || trm.term()->isSpecial()){ break; }
    t = trm.term(); 
  }
  return trm;
}